

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O1

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::ViewportCallOrderCase::iterate
          (ViewportCallOrderCase *this)

{
  RenderContext *context;
  undefined4 height;
  int iVar1;
  undefined4 uVar2;
  deUint32 err;
  undefined4 extraout_var;
  RenderTarget *pRVar4;
  TestLog *pTVar5;
  ConstPixelBufferAccess *access;
  Surface *surface;
  LogImageSet *access_00;
  void *__buf;
  void *__buf_00;
  char *description;
  void *__buf_01;
  qpTestResult testResult;
  void *pvVar6;
  int iVar7;
  int iVar8;
  float fVar9;
  Surface resultSurface;
  Surface errorMask;
  size_type __dnew;
  IVec4 pixel;
  int local_43c;
  Surface local_430;
  string local_418;
  float local_3f4;
  string local_3f0;
  Surface local_3d0;
  string local_3b8;
  undefined1 local_398 [40];
  string local_370;
  string local_350;
  string local_330;
  LogImageSet local_310;
  LogImage local_2d0;
  undefined1 local_240 [8];
  undefined1 local_238 [376];
  LogImage local_c0;
  long lVar3;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  pRVar4 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar1 = pRVar4->m_width;
  pRVar4 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar7 = pRVar4->m_height;
  uVar2 = (**(code **)(lVar3 + 0x780))
                    ((((this->m_program).
                       super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
                       .m_data.ptr)->m_program).m_program,"a_position");
  tcu::Surface::Surface(&local_430,iVar1,iVar7);
  (**(code **)(lVar3 + 0x1c0))(0,0,0,0x3f800000);
  (**(code **)(lVar3 + 0x188))(0x4000);
  iVar1 = iVar1 / 2;
  iVar8 = 1;
  do {
    if ((iVar8 == 1 && this->m_callOrder == VIEWPORT_FIRST) ||
       (this->m_callOrder == BBOX_FIRST && iVar8 == 0)) {
      local_240 = (undefined1  [8])
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_238);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_238,
                 "Setting viewport to cover the left half of the render target.\n",0x3e);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_238,"\t(0, 0, ",8);
      std::ostream::operator<<((ostringstream *)local_238,iVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_238,", ",2);
      std::ostream::operator<<((ostringstream *)local_238,iVar7);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_238,")",1);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_240,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_238);
      std::ios_base::~ios_base((ios_base *)(local_238 + 0x70));
      (**(code **)(lVar3 + 0x1a00))(0,0,iVar1,iVar7);
    }
    else {
      local_240 = (undefined1  [8])
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_238);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_238,
                 "Setting bounding box to cover the right half of the clip space.\n",0x40);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_238,"\t(0.0, -1.0, -1.0, 1.0) .. (1.0, 1.0, 1.0f, 1.0)",0x30);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_240,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_238);
      std::ios_base::~ios_base((ios_base *)(local_238 + 0x70));
      (**(code **)(lVar3 + 0x1040))
                (0,0xbf800000,0xbf800000,0x3f800000,0x3f800000,0x3f800000,0x3f800000,0x3f800000);
    }
    iVar8 = iVar8 + -1;
  } while (iVar8 == 0);
  local_240 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_238);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_238,"Rendering mesh covering the right half of the clip space.",0x39);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_240,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_238);
  std::ios_base::~ios_base((ios_base *)(local_238 + 0x70));
  (**(code **)(lVar3 + 0x40))
            (0x8892,(((this->m_vbo).
                      super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
                      .m_data.ptr)->super_ObjectWrapper).m_object);
  (**(code **)(lVar3 + 0x19f0))(uVar2,4,0x1406,0,0x10,0);
  (**(code **)(lVar3 + 0x610))(uVar2);
  (**(code **)(lVar3 + 0x1680))
            ((((this->m_program).
               super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>.m_data.
              ptr)->m_program).m_program);
  (**(code **)(lVar3 + 0xfd8))(0x8e72,3);
  (**(code **)(lVar3 + 0x538))(0xe,0,this->m_numVertices);
  err = (**(code **)(lVar3 + 0x800))();
  glu::checkError(err,"post-draw",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
                  ,0x128e);
  local_240 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_238);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_238,"Verifying image",0xf);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_240,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_238);
  std::ios_base::~ios_base((ios_base *)(local_238 + 0x70));
  context = ((this->super_TestCase).m_context)->m_renderCtx;
  local_2d0.m_name._M_dataplus._M_p = (pointer)0x300000008;
  pvVar6 = (void *)local_430.m_pixels.m_cap;
  if ((void *)local_430.m_pixels.m_cap != (void *)0x0) {
    pvVar6 = local_430.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_240,(TextureFormat *)&local_2d0,local_430.m_width,
             local_430.m_height,1,pvVar6);
  glu::readPixels(context,0,0,(PixelBufferAccess *)local_240);
  local_240._0_4_ = RGBA;
  local_240._4_4_ = UNORM_INT8;
  pvVar6 = (void *)local_430.m_pixels.m_cap;
  if ((void *)local_430.m_pixels.m_cap != (void *)0x0) {
    pvVar6 = local_430.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_398,(TextureFormat *)local_240,local_430.m_width,
             local_430.m_height,1,pvVar6);
  height = local_398._12_4_;
  uVar2 = local_398._8_4_;
  fVar9 = (float)(int)local_398._8_4_;
  local_3f4 = ceilf(fVar9 * 0.25);
  fVar9 = floorf(fVar9 * 0.25);
  tcu::Surface::Surface(&local_3d0,uVar2,height);
  local_2d0.m_name._M_dataplus._M_p = (pointer)0x300000008;
  if ((void *)local_3d0.m_pixels.m_cap != (void *)0x0) {
    local_3d0.m_pixels.m_cap = (size_t)local_3d0.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_240,(TextureFormat *)&local_2d0,local_3d0.m_width,
             local_3d0.m_height,1,(void *)local_3d0.m_pixels.m_cap);
  local_c0.m_name._M_dataplus._M_p._0_4_ = 0xff00ff00;
  tcu::RGBA::toIVec((RGBA *)&local_2d0);
  tcu::clear((PixelBufferAccess *)local_240,(IVec4 *)&local_2d0);
  iVar1 = 0;
  local_43c = iVar1;
  if (0 < (int)local_398._12_4_) {
    iVar7 = (int)local_3f4;
    local_43c = 0;
    do {
      if (0 < (int)local_398._8_4_) {
        iVar8 = 0;
        do {
          tcu::ConstPixelBufferAccess::getPixelInt
                    ((ConstPixelBufferAccess *)local_240,(int)local_398,iVar8,iVar1);
          if (((iVar7 + 1 == iVar8) && ((local_240._4_4_ != 0xff || (local_238._0_4_ != 0)))) ||
             (((int)fVar9 + -1 == iVar8 &&
              (((local_240._0_4_ != R || (local_240._4_4_ != SNORM_INT8)) || (local_238._0_4_ != 0))
              )))) {
            *(undefined4 *)
             ((long)local_3d0.m_pixels.m_ptr + (long)(local_3d0.m_width * iVar1 + iVar8) * 4) =
                 0xff0000ff;
            local_43c = 1;
          }
          iVar8 = iVar8 + 1;
        } while (iVar8 < (int)local_398._8_4_);
      }
      iVar1 = iVar1 + 1;
    } while (iVar1 < (int)local_398._12_4_);
  }
  if (local_43c == 0) {
    tcu::Surface::~Surface(&local_3d0);
  }
  else {
    local_240 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_238);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_238,"Image verification failed.",0x1a);
    pTVar5 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)local_240,(EndMessageToken *)&tcu::TestLog::EndMessage);
    local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
    local_3f0.field_2._M_allocated_capacity._0_4_ = 0x67616d49;
    local_3f0.field_2._M_allocated_capacity._4_2_ = 0x7365;
    local_3f0._M_string_length = 6;
    local_3f0.field_2._M_local_buf[6] = '\0';
    local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
    local_2d0.m_name._M_dataplus._M_p = (pointer)0x12;
    local_418._M_dataplus._M_p =
         (pointer)std::__cxx11::string::_M_create((ulong *)&local_418,(ulong)&local_2d0);
    local_418.field_2._M_allocated_capacity = (size_type)local_2d0.m_name._M_dataplus._M_p;
    *(undefined8 *)local_418._M_dataplus._M_p = 0x6576206567616d49;
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_418._M_dataplus._M_p + 8) = 'r';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_418._M_dataplus._M_p + 9) = 'i';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_418._M_dataplus._M_p + 10) = 'f';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_418._M_dataplus._M_p + 0xb) = 'i';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_418._M_dataplus._M_p + 0xc) = 'c';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_418._M_dataplus._M_p + 0xd) = 'a';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_418._M_dataplus._M_p + 0xe) = 't';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_418._M_dataplus._M_p + 0xf) = 'i';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_418._M_dataplus._M_p + 0x10) = 'o';
    *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_418._M_dataplus._M_p + 0x11) = 'n';
    local_418._M_string_length = (size_type)local_2d0.m_name._M_dataplus._M_p;
    local_418._M_dataplus._M_p[(long)local_2d0.m_name._M_dataplus._M_p] = '\0';
    tcu::LogImageSet::LogImageSet(&local_310,&local_3f0,&local_418);
    tcu::TestLog::startImageSet
              (pTVar5,local_310.m_name._M_dataplus._M_p,local_310.m_description._M_dataplus._M_p);
    local_3b8.field_2._M_allocated_capacity._0_7_ = 0x49746c75736552;
    local_3b8.field_2._7_4_ = 0x6567616d;
    local_3b8._M_string_length = 0xb;
    local_3b8.field_2._M_local_buf[0xb] = '\0';
    local_370.field_2._M_allocated_capacity = 0x6920746c75736552;
    local_370.field_2._8_4_ = 0x6567616d;
    local_370._M_string_length = 0xc;
    local_370.field_2._M_local_buf[0xc] = '\0';
    access = (ConstPixelBufferAccess *)local_398;
    local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
    local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
    tcu::LogImage::LogImage(&local_2d0,&local_3b8,&local_370,access,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write(&local_2d0,(int)pTVar5,__buf,(size_t)access);
    local_330.field_2._M_allocated_capacity = 0x73614d726f727245;
    local_330.field_2._8_2_ = 0x6b;
    local_330._M_string_length = 9;
    local_350.field_2._M_allocated_capacity = 0x616d20726f727245;
    local_350.field_2._8_2_ = 0x6b73;
    local_350._M_string_length = 10;
    local_350.field_2._M_local_buf[10] = '\0';
    surface = &local_3d0;
    local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
    local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
    tcu::LogImage::LogImage(&local_c0,&local_330,&local_350,surface,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write(&local_c0,(int)pTVar5,__buf_00,(size_t)surface);
    tcu::TestLog::endImageSet(pTVar5);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0.m_description._M_dataplus._M_p != &local_c0.m_description.field_2) {
      operator_delete(local_c0.m_description._M_dataplus._M_p,
                      local_c0.m_description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_c0.m_name._M_dataplus._M_p._4_4_,local_c0.m_name._M_dataplus._M_p._0_4_)
        != &local_c0.m_name.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_c0.m_name._M_dataplus._M_p._4_4_,
                               local_c0.m_name._M_dataplus._M_p._0_4_),
                      local_c0.m_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_350._M_dataplus._M_p != &local_350.field_2) {
      operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_330._M_dataplus._M_p != &local_330.field_2) {
      operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0.m_description._M_dataplus._M_p != &local_2d0.m_description.field_2) {
      operator_delete(local_2d0.m_description._M_dataplus._M_p,
                      local_2d0.m_description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0.m_name._M_dataplus._M_p != &local_2d0.m_name.field_2) {
      operator_delete(local_2d0.m_name._M_dataplus._M_p,
                      local_2d0.m_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_370._M_dataplus._M_p != &local_370.field_2) {
      operator_delete(local_370._M_dataplus._M_p,local_370.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
      operator_delete(local_3b8._M_dataplus._M_p,
                      CONCAT17(local_3b8.field_2._M_local_buf[7],
                               local_3b8.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_310.m_description._M_dataplus._M_p != &local_310.m_description.field_2) {
      operator_delete(local_310.m_description._M_dataplus._M_p,
                      local_310.m_description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_310.m_name._M_dataplus._M_p != &local_310.m_name.field_2) {
      operator_delete(local_310.m_name._M_dataplus._M_p,
                      local_310.m_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_418._M_dataplus._M_p != &local_418.field_2) {
      operator_delete(local_418._M_dataplus._M_p,
                      (ulong)(local_418.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
      operator_delete(local_3f0._M_dataplus._M_p,
                      CONCAT17(local_3f0.field_2._M_local_buf[7],
                               CONCAT16(local_3f0.field_2._M_local_buf[6],
                                        CONCAT24(local_3f0.field_2._M_allocated_capacity._4_2_,
                                                 local_3f0.field_2._M_allocated_capacity._0_4_))) +
                      1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_238);
    std::ios_base::~ios_base((ios_base *)(local_238 + 0x70));
    tcu::Surface::~Surface(&local_3d0);
    if (local_43c != 0) {
      description = "Image verification failed";
      testResult = QP_TEST_RESULT_FAIL;
      goto LAB_01683dce;
    }
  }
  local_240 = (undefined1  [8])
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_238);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_238,"Result ok.",10);
  pTVar5 = tcu::MessageBuilder::operator<<
                     ((MessageBuilder *)local_240,(EndMessageToken *)&tcu::TestLog::EndMessage);
  local_398._0_8_ = (long)local_398 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_398,"Images","");
  local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3f0,"Image verification","");
  tcu::LogImageSet::LogImageSet((LogImageSet *)&local_c0,(string *)local_398,&local_3f0);
  tcu::TestLog::startImageSet
            (pTVar5,(char *)CONCAT44(local_c0.m_name._M_dataplus._M_p._4_4_,
                                     local_c0.m_name._M_dataplus._M_p._0_4_),
             local_c0.m_description._M_dataplus._M_p);
  local_418._M_dataplus._M_p = (pointer)&local_418.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_418,"Result","");
  local_3b8._M_dataplus._M_p = (pointer)&local_3b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b8,"Result","");
  local_370._M_dataplus._M_p = (pointer)0x300000008;
  if ((void *)local_430.m_pixels.m_cap != (void *)0x0) {
    local_430.m_pixels.m_cap = (size_t)local_430.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)&local_310,(TextureFormat *)&local_370,local_430.m_width,
             local_430.m_height,1,(void *)local_430.m_pixels.m_cap);
  access_00 = &local_310;
  tcu::LogImage::LogImage
            (&local_2d0,&local_418,&local_3b8,(ConstPixelBufferAccess *)access_00,
             QP_IMAGE_COMPRESSION_MODE_BEST);
  tcu::LogImage::write(&local_2d0,(int)pTVar5,__buf_01,(size_t)access_00);
  tcu::TestLog::endImageSet(pTVar5);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0.m_description._M_dataplus._M_p != &local_2d0.m_description.field_2) {
    operator_delete(local_2d0.m_description._M_dataplus._M_p,
                    local_2d0.m_description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d0.m_name._M_dataplus._M_p != &local_2d0.m_name.field_2) {
    operator_delete(local_2d0.m_name._M_dataplus._M_p,
                    local_2d0.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
    operator_delete(local_3b8._M_dataplus._M_p,
                    CONCAT17(local_3b8.field_2._M_local_buf[7],
                             local_3b8.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_418._M_dataplus._M_p != &local_418.field_2) {
    operator_delete(local_418._M_dataplus._M_p,(ulong)(local_418.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.m_description._M_dataplus._M_p != &local_c0.m_description.field_2) {
    operator_delete(local_c0.m_description._M_dataplus._M_p,
                    local_c0.m_description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)CONCAT44(local_c0.m_name._M_dataplus._M_p._4_4_,local_c0.m_name._M_dataplus._M_p._0_4_) !=
      &local_c0.m_name.field_2) {
    operator_delete((undefined1 *)
                    CONCAT44(local_c0.m_name._M_dataplus._M_p._4_4_,
                             local_c0.m_name._M_dataplus._M_p._0_4_),
                    local_c0.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
    operator_delete(local_3f0._M_dataplus._M_p,
                    CONCAT17(local_3f0.field_2._M_local_buf[7],
                             CONCAT16(local_3f0.field_2._M_local_buf[6],
                                      CONCAT24(local_3f0.field_2._M_allocated_capacity._4_2_,
                                               local_3f0.field_2._M_allocated_capacity._0_4_))) + 1)
    ;
  }
  if (local_398._0_8_ != (long)local_398 + 0x10) {
    operator_delete((void *)local_398._0_8_,local_398._16_8_ + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_238);
  std::ios_base::~ios_base((ios_base *)(local_238 + 0x70));
  description = "Pass";
  testResult = QP_TEST_RESULT_PASS;
LAB_01683dce:
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,testResult,description);
  tcu::Surface::~Surface(&local_430);
  return STOP;
}

Assistant:

ViewportCallOrderCase::IterateResult ViewportCallOrderCase::iterate (void)
{
	const glw::Functions&	gl				= m_context.getRenderContext().getFunctions();
	const tcu::IVec2		viewportSize	= tcu::IVec2(m_context.getRenderTarget().getWidth(), m_context.getRenderTarget().getHeight());
	const glw::GLint		posLocation		= gl.getAttribLocation(m_program->getProgram(), "a_position");
	tcu::Surface			resultSurface	(viewportSize.x(), viewportSize.y());

	gl.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
	gl.clear(GL_COLOR_BUFFER_BIT);

	// set state
	for (int orderNdx = 0; orderNdx < 2; ++orderNdx)
	{
		if ((orderNdx == 0 && m_callOrder == VIEWPORT_FIRST) ||
			(orderNdx == 1 && m_callOrder == BBOX_FIRST))
		{
			m_testCtx.getLog()
				<< tcu::TestLog::Message
				<< "Setting viewport to cover the left half of the render target.\n"
				<< "\t(0, 0, " << (viewportSize.x()/2) << ", " << viewportSize.y() << ")"
				<< tcu::TestLog::EndMessage;

			gl.viewport(0, 0, viewportSize.x()/2, viewportSize.y());
		}
		else
		{
			m_testCtx.getLog()
				<< tcu::TestLog::Message
				<< "Setting bounding box to cover the right half of the clip space.\n"
				<< "\t(0.0, -1.0, -1.0, 1.0) .. (1.0, 1.0, 1.0f, 1.0)"
				<< tcu::TestLog::EndMessage;

			gl.primitiveBoundingBox(0.0f, -1.0f, -1.0f, 1.0f,
									1.0f,  1.0f,  1.0f, 1.0f);
		}
	}

	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Rendering mesh covering the right half of the clip space."
		<< tcu::TestLog::EndMessage;

	gl.bindBuffer(GL_ARRAY_BUFFER, **m_vbo);
	gl.vertexAttribPointer(posLocation, 4, GL_FLOAT, GL_FALSE, sizeof(float[4]), (const float*)DE_NULL);
	gl.enableVertexAttribArray(posLocation);
	gl.useProgram(m_program->getProgram());
	gl.patchParameteri(GL_PATCH_VERTICES, 3);
	gl.drawArrays(GL_PATCHES, 0, m_numVertices);
	GLU_EXPECT_NO_ERROR(gl.getError(), "post-draw");

	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Verifying image"
		<< tcu::TestLog::EndMessage;
	glu::readPixels(m_context.getRenderContext(), 0, 0, resultSurface.getAccess());

	if (!verifyImage(resultSurface.getAccess()))
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image verification failed");
	else
	{
		m_testCtx.getLog()
			<< tcu::TestLog::Message
			<< "Result ok."
			<< tcu::TestLog::EndMessage
			<< tcu::TestLog::ImageSet("Images", "Image verification")
			<< tcu::TestLog::Image("Result", "Result", resultSurface.getAccess())
			<< tcu::TestLog::EndImageSet;

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	return STOP;
}